

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O2

void PHYSFS_utf8FromUtf16(PHYSFS_uint16 *src,char *dst,PHYSFS_uint64 len)

{
  PHYSFS_uint32 cp;
  long in_RDX;
  char *in_RSI;
  PHYSFS_uint64 local_30;
  char *local_28;
  PHYSFS_uint16 *local_20;
  
  if (in_RDX != 0) {
    local_30 = in_RDX - 1;
    if (local_30 != 0) {
      local_28 = in_RSI;
      do {
        cp = utf16codepoint(&local_20);
        in_RSI = local_28;
        if (cp == 0) break;
        utf8fromcodepoint(cp,&local_28,&local_30);
        in_RSI = local_28;
      } while (local_30 != 0);
    }
    *in_RSI = '\0';
  }
  return;
}

Assistant:

void PHYSFS_utf8FromUtf16(const PHYSFS_uint16 *src, char *dst, PHYSFS_uint64 len)
{
    if (len == 0)
        return;

    len--;
    while (len)
    {
        const PHYSFS_uint32 cp = utf16codepoint(&src);
        if (!cp)
            break;
        utf8fromcodepoint(cp, &dst, &len);
    } /* while */

    *dst = '\0';
}